

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

string * __thiscall
util::make_string<CylHead&,char_const(&)[46]>
          (string *__return_storage_ptr__,util *this,CylHead *args,char (*args_1) [46])

{
  ostringstream ss;
  ostringstream aoStack_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  ::operator<<((ostream *)aoStack_198,(CylHead *)this);
  std::operator<<((ostream *)aoStack_198,(char *)args);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}